

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O2

ostream * vkt::ubo::operator<<(ostream *stream,UniformLayoutEntry *entry)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<(stream,(string *)entry);
  poVar1 = std::operator<<(poVar1," { type = ");
  pcVar2 = glu::getDataTypeName(entry->type);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,", size = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->size);
  poVar1 = std::operator<<(poVar1,", blockNdx = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->blockLayoutNdx);
  poVar1 = std::operator<<(poVar1,", offset = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->offset);
  poVar1 = std::operator<<(poVar1,", arrayStride = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->arrayStride);
  poVar1 = std::operator<<(poVar1,", matrixStride = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->matrixStride);
  poVar1 = std::operator<<(poVar1,", isRowMajor = ");
  pcVar2 = "false";
  if (entry->isRowMajor != false) {
    pcVar2 = "true";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1," }");
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const UniformLayoutEntry& entry)
{
	stream << entry.name << " { type = " << glu::getDataTypeName(entry.type)
		   << ", size = " << entry.size
		   << ", blockNdx = " << entry.blockLayoutNdx
		   << ", offset = " << entry.offset
		   << ", arrayStride = " << entry.arrayStride
		   << ", matrixStride = " << entry.matrixStride
		   << ", isRowMajor = " << (entry.isRowMajor ? "true" : "false")
		   << " }";
	return stream;
}